

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O0

void __thiscall
jaegertracing::samplers::Config::Config
          (Config *this,string *type,double param,string *samplingServerURL,int maxOperations,
          duration *samplingRefreshInterval)

{
  ulong uVar1;
  rep rVar2;
  duration dVar3;
  int local_8c;
  string *local_70;
  allocator local_4d [19];
  byte local_3a;
  allocator local_39;
  duration *local_38;
  duration *samplingRefreshInterval_local;
  string *psStack_28;
  int maxOperations_local;
  string *samplingServerURL_local;
  double param_local;
  string *type_local;
  Config *this_local;
  
  local_38 = samplingRefreshInterval;
  samplingRefreshInterval_local._4_4_ = maxOperations;
  psStack_28 = samplingServerURL;
  samplingServerURL_local = (string *)param;
  param_local = (double)type;
  type_local = &this->_type;
  uVar1 = std::__cxx11::string::empty();
  local_3a = 0;
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)this,(string *)param_local);
  }
  else {
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string((string *)this,"remote",&local_39);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  if (((double)samplingServerURL_local != -1.0) || (NAN((double)samplingServerURL_local))) {
    local_70 = samplingServerURL_local;
  }
  else {
    local_70 = (string *)0x3f50624dd2f1a9fc;
  }
  this->_param = (double)local_70;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)&this->_samplingServerURL,(string *)psStack_28);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&this->_samplingServerURL,"http://127.0.0.1:5778/sampling",local_4d);
    std::allocator<char>::~allocator((allocator<char> *)local_4d);
  }
  if (samplingRefreshInterval_local._4_4_ == 0) {
    local_8c = 2000;
  }
  else {
    local_8c = samplingRefreshInterval_local._4_4_;
  }
  this->_maxOperations = local_8c;
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(local_38);
  if (rVar2 < 1) {
    dVar3 = defaultSamplingRefreshInterval();
    (this->_samplingRefreshInterval).__r = dVar3.__r;
  }
  else {
    (this->_samplingRefreshInterval).__r = local_38->__r;
  }
  return;
}

Assistant:

explicit Config(
        const std::string& type = kSamplerTypeRemote,
        double param = kDefaultSamplingProbability,
        const std::string& samplingServerURL = kDefaultSamplingServerURL,
        int maxOperations = kDefaultMaxOperations,
        const Clock::duration& samplingRefreshInterval =
            defaultSamplingRefreshInterval())
        : _type(type.empty() ? kSamplerTypeRemote : type)
        , _param(param == -1 ? kDefaultSamplingProbability : param)
        , _samplingServerURL(samplingServerURL.empty()
                                 ? kDefaultSamplingServerURL
                                 : samplingServerURL)
        , _maxOperations(maxOperations == 0 ? kDefaultMaxOperations
                                            : maxOperations)
        , _samplingRefreshInterval(samplingRefreshInterval.count() > 0
                                       ? samplingRefreshInterval
                                       : defaultSamplingRefreshInterval())
    {
    }